

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_3f1a5b::HandleRemoveImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool recurse,cmExecutionStatus *status)

{
  cmMakefile *this;
  bool bVar1;
  string *a;
  pointer pbVar2;
  undefined7 in_register_00000031;
  pointer args_00;
  string fileName;
  string r;
  string local_c0;
  char *local_a0;
  pointer local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  args_00 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_a0 = "REMOVE";
  if ((int)CONCAT71(in_register_00000031,recurse) != 0) {
    local_a0 = "REMOVE_RECURSE";
  }
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_98 = pbVar2;
  do {
    args_00 = args_00 + 1;
    if (args_00 == local_98) {
      return SUB81(pbVar2,0);
    }
    std::__cxx11::string::string((string *)&local_c0,(string *)args_00);
    if (local_c0._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,local_a0,(allocator<char> *)&local_70);
      this = status->Makefile;
      std::operator+(&local_50,"Ignoring empty file name in ",&local_90);
      std::operator+(&local_70,&local_50,".");
      cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      bVar1 = cmsys::SystemTools::FileIsFullPath(&local_c0);
      if (!bVar1) {
        a = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
        local_70._M_dataplus._M_p._0_1_ = 0x2f;
        cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                  (&local_90,a,(char *)&local_70,args_00);
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      bVar1 = cmsys::SystemTools::FileIsDirectory(&local_c0);
      if (bVar1) {
        bVar1 = cmsys::SystemTools::FileIsSymlink(&local_c0);
        if (!bVar1 && recurse) {
          cmSystemTools::RepeatedRemoveDirectory(&local_c0);
          goto LAB_001f756e;
        }
      }
      cmsys::SystemTools::RemoveFile(&local_c0);
    }
LAB_001f756e:
    pbVar2 = (pointer)std::__cxx11::string::~string((string *)&local_c0);
  } while( true );
}

Assistant:

bool HandleRemoveImpl(std::vector<std::string> const& args, bool recurse,
                      cmExecutionStatus& status)
{
  for (std::string const& arg :
       cmMakeRange(args).advance(1)) // Get rid of subcommand
  {
    std::string fileName = arg;
    if (fileName.empty()) {
      std::string const r = recurse ? "REMOVE_RECURSE" : "REMOVE";
      status.GetMakefile().IssueMessage(
        MessageType::AUTHOR_WARNING, "Ignoring empty file name in " + r + ".");
      continue;
    }
    if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
      fileName =
        cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', arg);
    }

    if (cmSystemTools::FileIsDirectory(fileName) &&
        !cmSystemTools::FileIsSymlink(fileName) && recurse) {
      cmSystemTools::RepeatedRemoveDirectory(fileName);
    } else {
      cmSystemTools::RemoveFile(fileName);
    }
  }
  return true;
}